

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_criticalsection::test_method(util_criticalsection *this)

{
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  RecursiveMutex cs;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> lockTest;
  check_type cVar1;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  assertion_result local_b0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  __native_type local_78;
  unique_lock<std::recursive_mutex> local_48;
  undefined1 *local_38;
  char **local_30;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_78.__align = 0;
  local_78._8_8_ = 0;
  local_78.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_78._16_8_ = 1;
  local_48._M_owns = false;
  local_48._M_device = (mutex_type *)&local_78;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  local_28._M_owns = false;
  local_28._M_device = (mutex_type *)&local_78;
  std::unique_lock<std::recursive_mutex>::try_lock(&local_28);
  if (local_28._M_owns == true) {
    local_88 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_80 = "";
    local_98 = &boost::unit_test::basic_cstring<char_const>::null;
    local_90 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x86;
    file.m_begin = (iterator)&local_88;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_98,msg);
    local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    local_b0.m_message.px = (element_type *)0x0;
    local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_30 = &local_c0;
    local_c0 = "true";
    local_b8 = "";
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)&PTR__lazy_ostream_01389048;
    local_38 = boost::unit_test::lazy_ostream::inst;
    local_d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_c8 = "";
    boost::test_tools::tt_detail::report_assertion
              (&local_b0,(lazy_ostream *)&local_48,1,0,WARN,_cVar1,(size_t)&local_d0,0x86);
  }
  else {
    local_e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_d8 = "";
    local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x8a;
    file_00.m_begin = (iterator)&local_e0;
    msg_00.m_end = in_R9;
    msg_00.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_f0,
               msg_00);
    local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
    local_b0.m_message.px = (element_type *)0x0;
    local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_48._M_owns = false;
    local_48._M_device = (mutex_type *)&PTR__lazy_ostream_0138af58;
    local_38 = boost::unit_test::lazy_ostream::inst;
    local_30 = (char **)0xf4a588;
    boost::test_tools::tt_detail::report_assertion
              (&local_b0,(lazy_ostream *)&local_48,1,1,WARN,0xf4a348,
               (size_t)&stack0xffffffffffffff00,0x8a);
  }
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_criticalsection)
{
    RecursiveMutex cs;

    do {
        LOCK(cs);
        break;

        BOOST_ERROR("break was swallowed!");
    } while(0);

    do {
        TRY_LOCK(cs, lockTest);
        if (lockTest) {
            BOOST_CHECK(true); // Needed to suppress "Test case [...] did not check any assertions"
            break;
        }

        BOOST_ERROR("break was swallowed!");
    } while(0);
}